

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v8::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  char *pcVar1;
  char *pcVar2;
  char *ptr;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar3;
  type size;
  size_t __n;
  anon_class_8_1_54a39806 decode;
  anon_class_8_1_54a39806 local_38;
  char local_30 [8];
  
  pcVar2 = (char *)s.size_;
  pcVar3 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_0019dc90;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar1 = pcVar3;
  local_38.f.this = (anon_class_8_1_8991fb9c_for_f)(anon_class_8_1_8991fb9c_for_f)this;
  if (pcVar2 < (char *)0x4) {
LAB_0015d6d7:
    __n = (long)(pcVar3 + (long)pcVar2) - (long)pcVar1;
    if (__n != 0) {
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[0] = '\0';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      memcpy(local_30,pcVar1,__n);
      pcVar1 = local_30;
      pcVar2 = extraout_RDX_00;
      do {
        pcVar1 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format-inl.h:2548:25)>
                 ::anon_class_8_1_54a39806::operator()(&local_38,pcVar1,pcVar2);
        if (pcVar1 == (char *)0x0) break;
        pcVar2 = extraout_RDX_01;
      } while ((long)pcVar1 - (long)local_30 < (long)__n);
    }
  }
  else {
    ptr = pcVar2;
    do {
      if (pcVar3 + (long)pcVar2 + -3 <= pcVar1) goto LAB_0015d6d7;
      pcVar1 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format-inl.h:2548:25)>
               ::anon_class_8_1_54a39806::operator()(&local_38,pcVar1,ptr);
      ptr = extraout_RDX;
    } while (pcVar1 != (char *)0x0);
  }
  local_38.f.this = (anon_class_8_1_8991fb9c_for_f)((ulong)local_38.f.this & 0xffffffff00000000);
  buffer<wchar_t>::push_back((buffer<wchar_t> *)this,(wchar_t *)&local_38);
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}